

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

void rw::AnimInterpolatorInfo::registerInterp(AnimInterpolatorInfo *interpInfo)

{
  int local_14;
  int32 i;
  AnimInterpolatorInfo *interpInfo_local;
  
  local_14 = 0;
  while( true ) {
    if (9 < local_14) {
      return;
    }
    if (*(long *)(interpInfoList + (long)local_14 * 8) == 0) break;
    local_14 = local_14 + 1;
  }
  *(AnimInterpolatorInfo **)(interpInfoList + (long)local_14 * 8) = interpInfo;
  return;
}

Assistant:

void
AnimInterpolatorInfo::registerInterp(AnimInterpolatorInfo *interpInfo)
{
	for(int32 i = 0; i < MAXINTERPINFO; i++)
		if(interpInfoList[i] == nil){
			interpInfoList[i] = interpInfo;
			return;
		}
	assert(0 && "no room for interpolatorInfo");
}